

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::doAddName(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
            *this,string *name)

{
  bool bVar1;
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  put_holder<char,_std::char_traits<char>_> local_110;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  bVar1 = concepts::
          NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::add((NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this->field_0x22,name,0);
  if (bVar1) {
    concepts::
    NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    add((NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&this->field_0x20,name);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"Cannot add duplicate name: %1%");
  local_110.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_110.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_110.arg = name;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_f8,&local_110);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void doAddName(const std::string &name) { 
        if (! nameIndex_.add(name, leafNameAttributes_.size())) {
            throw Exception(boost::format("Cannot add duplicate name: %1%") % name);
        }
        leafNameAttributes_.add(name);
    }